

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O0

X509_EXTENSION *
X509_EXTENSION_create_by_OBJ(X509_EXTENSION **ex,ASN1_OBJECT *obj,int crit,ASN1_OCTET_STRING *data)

{
  int iVar1;
  X509_EXTENSION *local_38;
  X509_EXTENSION *ret;
  ASN1_OCTET_STRING *data_local;
  int crit_local;
  ASN1_OBJECT *obj_local;
  X509_EXTENSION **ex_local;
  
  if ((ex == (X509_EXTENSION **)0x0) || (*ex == (X509_EXTENSION *)0x0)) {
    local_38 = X509_EXTENSION_new();
    if (local_38 == (X509_EXTENSION *)0x0) {
      return (X509_EXTENSION *)0x0;
    }
  }
  else {
    local_38 = *ex;
  }
  iVar1 = X509_EXTENSION_set_object(local_38,obj);
  if (((iVar1 == 0) || (iVar1 = X509_EXTENSION_set_critical(local_38,crit), iVar1 == 0)) ||
     (iVar1 = X509_EXTENSION_set_data(local_38,data), iVar1 == 0)) {
    if ((ex == (X509_EXTENSION **)0x0) || (local_38 != *ex)) {
      X509_EXTENSION_free(local_38);
    }
    ex_local = (X509_EXTENSION **)0x0;
  }
  else {
    if ((ex != (X509_EXTENSION **)0x0) && (*ex == (X509_EXTENSION *)0x0)) {
      *ex = local_38;
    }
    ex_local = (X509_EXTENSION **)local_38;
  }
  return (X509_EXTENSION *)ex_local;
}

Assistant:

X509_EXTENSION *X509_EXTENSION_create_by_OBJ(X509_EXTENSION **ex,
                                             const ASN1_OBJECT *obj, int crit,
                                             const ASN1_OCTET_STRING *data) {
  X509_EXTENSION *ret;

  if ((ex == NULL) || (*ex == NULL)) {
    if ((ret = X509_EXTENSION_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = *ex;
  }

  if (!X509_EXTENSION_set_object(ret, obj)) {
    goto err;
  }
  if (!X509_EXTENSION_set_critical(ret, crit)) {
    goto err;
  }
  if (!X509_EXTENSION_set_data(ret, data)) {
    goto err;
  }

  if ((ex != NULL) && (*ex == NULL)) {
    *ex = ret;
  }
  return ret;
err:
  if ((ex == NULL) || (ret != *ex)) {
    X509_EXTENSION_free(ret);
  }
  return NULL;
}